

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O2

bool __thiscall
Plan::RefreshDyndepDependents(Plan *this,DependencyScan *scan,Node *node,string *err)

{
  _Rb_tree_header *p_Var1;
  Node *node_00;
  bool bVar2;
  iterator iVar3;
  _Base_ptr p_Var4;
  Edge *edge;
  set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> dependents;
  Edge *local_70;
  _Base_ptr local_68;
  _Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
  local_60;
  
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  UnmarkDependents(this,node,(set<Node_*,_std::less<Node_*>,_std::allocator<Node_*>_> *)&local_60);
  local_68 = &(this->want_)._M_t._M_impl.super__Rb_tree_header._M_header;
  for (p_Var4 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    node_00 = *(Node **)(p_Var4 + 1);
    bVar2 = DependencyScan::RecomputeDirty(scan,node_00,err);
    if (!bVar2) break;
    if (node_00->dirty_ == true) {
      local_70 = node_00->in_edge_;
      if ((local_70 == (Edge *)0x0) || (local_70->outputs_ready_ == true)) {
        __assert_fail("edge && !edge->outputs_ready()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build.cc"
                      ,0x272,
                      "bool Plan::RefreshDyndepDependents(DependencyScan *, const Node *, string *)"
                     );
      }
      iVar3 = std::
              _Rb_tree<Edge_*,_std::pair<Edge_*const,_Plan::Want>,_std::_Select1st<std::pair<Edge_*const,_Plan::Want>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
              ::find((_Rb_tree<Edge_*,_std::pair<Edge_*const,_Plan::Want>,_std::_Select1st<std::pair<Edge_*const,_Plan::Want>_>,_std::less<Edge_*>,_std::allocator<std::pair<Edge_*const,_Plan::Want>_>_>
                      *)this,&local_70);
      if (iVar3._M_node == local_68) {
        __assert_fail("want_e != want_.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build.cc"
                      ,0x274,
                      "bool Plan::RefreshDyndepDependents(DependencyScan *, const Node *, string *)"
                     );
      }
      if (*(int *)&iVar3._M_node[1]._M_parent == 0) {
        *(undefined4 *)&iVar3._M_node[1]._M_parent = 1;
        EdgeWanted(this,local_70);
      }
    }
  }
  std::_Rb_tree<Node_*,_Node_*,_std::_Identity<Node_*>,_std::less<Node_*>,_std::allocator<Node_*>_>
  ::~_Rb_tree(&local_60);
  return (_Rb_tree_header *)p_Var4 == p_Var1;
}

Assistant:

bool Plan::RefreshDyndepDependents(DependencyScan* scan, const Node* node,
                                   string* err) {
  // Collect the transitive closure of dependents and mark their edges
  // as not yet visited by RecomputeDirty.
  set<Node*> dependents;
  UnmarkDependents(node, &dependents);

  // Update the dirty state of all dependents and check if their edges
  // have become wanted.
  for (set<Node*>::iterator i = dependents.begin();
       i != dependents.end(); ++i) {
    Node* n = *i;

    // Check if this dependent node is now dirty.  Also checks for new cycles.
    if (!scan->RecomputeDirty(n, err))
      return false;
    if (!n->dirty())
      continue;

    // This edge was encountered before.  However, we may not have wanted to
    // build it if the outputs were not known to be dirty.  With dyndep
    // information an output is now known to be dirty, so we want the edge.
    Edge* edge = n->in_edge();
    assert(edge && !edge->outputs_ready());
    map<Edge*, Want>::iterator want_e = want_.find(edge);
    assert(want_e != want_.end());
    if (want_e->second == kWantNothing) {
      want_e->second = kWantToStart;
      EdgeWanted(edge);
    }
  }
  return true;
}